

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_verifyObjLimitReal(SoPlexBase<double> *this)

{
  bool bVar1;
  Verbosity VVar2;
  element_type *peVar3;
  double *in_RDI;
  Real RVar4;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool dualfeasible;
  double redcostviol;
  double dualviol;
  double sumviol;
  Verbosity old_verbosity;
  bool *in_stack_00000060;
  bool in_stack_0000006f;
  SoPlexBase<double> *in_stack_00000070;
  _func_ostream_ptr_ostream_ptr *in_stack_ffffffffffffffa8;
  SPxSolverBase<double> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  Verbosity in_stack_ffffffffffffffc4;
  Verbosity in_stack_ffffffffffffffc8;
  Verbosity in_stack_ffffffffffffffcc;
  Verbosity local_30;
  byte local_29;
  _func_ostream_ptr_ostream_ptr *local_28;
  SPxSolverBase<double> *local_20;
  undefined8 local_18;
  Verbosity local_10;
  Verbosity local_c [3];
  
  if ((in_RDI != (double *)0xfffffffffffffff8) &&
     (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1)), 2 < (int)VVar2)) {
    local_c[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1));
    local_10 = INFO1;
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),&local_10);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),local_c);
  }
  local_18 = 0;
  local_20 = (SPxSolverBase<double> *)0x0;
  local_28 = (_func_ostream_ptr_ostream_ptr *)0x0;
  local_29 = 1;
  bVar1 = getDualViolation((SoPlexBase<double> *)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (double *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_RDI);
  if (!bVar1) {
    local_29 = 0;
  }
  bVar1 = getRedCostViolation((SoPlexBase<double> *)
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                              (double *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  if (!bVar1) {
    local_29 = 0;
  }
  if ((local_29 & 1) != 0) {
    in_stack_ffffffffffffffb0 = local_20;
    SPxSolverBase<double>::tolerances((SPxSolverBase<double> *)(in_RDI + 0x30));
    peVar3 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x45f452);
    RVar4 = Tolerances::floatingPointOpttol(peVar3);
    if ((double)in_stack_ffffffffffffffb0 < RVar4) {
      in_stack_ffffffffffffffa8 = local_28;
      SPxSolverBase<double>::tolerances((SPxSolverBase<double> *)(in_RDI + 0x30));
      peVar3 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x45f48d);
      RVar4 = Tolerances::floatingPointOpttol(peVar3);
      if ((double)in_stack_ffffffffffffffa8 < RVar4) {
        return;
      }
    }
  }
  if ((in_RDI != (double *)0xfffffffffffffff8) &&
     (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1)), 4 < (int)VVar2)) {
    local_30 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1));
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),(Verbosity *)&stack0xffffffffffffffcc);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,(double)in_stack_ffffffffffffffa8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),&local_30);
  }
  if ((in_RDI != (double *)0xfffffffffffffff8) &&
     (VVar2 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 1)), 2 < (int)VVar2)) {
    SPxOut::getVerbosity((SPxOut *)(in_RDI + 1));
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),(Verbosity *)&stack0xffffffffffffffc4);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8);
    soplex::operator<<((SPxOut *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    SPxOut::setVerbosity((SPxOut *)(in_RDI + 1),(Verbosity *)&stack0xffffffffffffffc8);
  }
  if ((in_RDI[0x39e] == 0.0) && (in_RDI[0x39d] == 0.0)) {
    SPxSolverBase<double>::toggleTerminationValue((SPxSolverBase<double> *)(in_RDI + 0x30),false);
  }
  else if ((*(byte *)((long)in_RDI + 0x4379) & 1) != 0) {
    SPxSolverBase<double>::unscaleLPandReloadBasis(in_stack_ffffffffffffffb0);
    *(undefined1 *)((long)in_RDI + 0x4379) = 0;
    *(int *)(in_RDI + 0xa1b) = *(int *)(in_RDI + 0xa1b) + 1;
  }
  _preprocessAndSolveReal(in_stack_00000070,in_stack_0000006f,in_stack_00000060);
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}